

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_input_glyph(nk_context *ctx,char *glyph)

{
  nk_input *in;
  nk_rune unicode;
  int len;
  char *glyph_local;
  nk_context *ctx_local;
  
  in._4_4_ = 0;
  _unicode = glyph;
  glyph_local = (char *)ctx;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x3675,"void nk_input_glyph(struct nk_context *, const char *)");
  }
  if (((ctx != (nk_context *)0x0) &&
      (in._4_4_ = nk_utf_decode(glyph,(nk_rune *)&in,4), in._4_4_ != 0)) &&
     ((ctx->input).keyboard.text_len + in._4_4_ < 0x10)) {
    nk_utf_encode((nk_rune)in,(ctx->input).keyboard.text + (ctx->input).keyboard.text_len,
                  0x10 - (ctx->input).keyboard.text_len);
    (ctx->input).keyboard.text_len = in._4_4_ + (ctx->input).keyboard.text_len;
  }
  return;
}

Assistant:

NK_API void
nk_input_glyph(struct nk_context *ctx, const nk_glyph glyph)
{
    int len = 0;
    nk_rune unicode;
    struct nk_input *in;

    NK_ASSERT(ctx);
    if (!ctx) return;
    in = &ctx->input;

    len = nk_utf_decode(glyph, &unicode, NK_UTF_SIZE);
    if (len && ((in->keyboard.text_len + len) < NK_INPUT_MAX)) {
        nk_utf_encode(unicode, &in->keyboard.text[in->keyboard.text_len],
            NK_INPUT_MAX - in->keyboard.text_len);
        in->keyboard.text_len += len;
    }
}